

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab_cursor *ppStmt;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  Rtree *pRtree;
  int iVar4;
  int iVar5;
  RtreeNode *pNode;
  sqlite3_value *pValue;
  i64 iVar6;
  sqlite3_vtab *psVar7;
  sqlite3_vtab *pStmt;
  long in_FS_OFFSET;
  int local_40;
  RtreeCoord c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar7 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar7 = cur[6].pVtab;
    }
  }
  else {
    psVar7 = (sqlite3_vtab *)(cur + 8);
  }
  pRtree = (Rtree *)cur->pVtab;
  c.i = -1;
  local_40 = 0;
  pNode = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_40);
  iVar5 = local_40;
  if ((local_40 == 0) && (iVar5 = 0, psVar7 != (sqlite3_vtab *)0x0)) {
    bVar1 = *(byte *)((long)&psVar7->zErrMsg + 2);
    uVar3 = *(ushort *)(pNode->zData + 2);
    if ((ushort)bVar1 < (ushort)(uVar3 << 8 | uVar3 >> 8)) {
      if (i == 0) {
        iVar6 = nodeGetRowid(pRtree,pNode,(uint)bVar1);
        sqlite3_result_int64(ctx,iVar6);
      }
      else {
        bVar2 = pRtree->nDim2;
        if ((int)(uint)bVar2 < i) {
          if (*(char *)((long)&cur[1].pVtab + 2) == '\0') {
            ppStmt = cur + 7;
            pStmt = cur[7].pVtab;
            if (pStmt == (sqlite3_vtab *)0x0) {
              iVar5 = sqlite3_prepare_v3(pRtree->db,pRtree->zReadAuxSql,-1,0,(sqlite3_stmt **)ppStmt
                                         ,(char **)0x0);
              if (iVar5 != 0) goto LAB_001d96e6;
              pStmt = ppStmt->pVtab;
              bVar1 = *(byte *)((long)&psVar7->zErrMsg + 2);
            }
            iVar6 = nodeGetRowid(pRtree,pNode,(uint)bVar1);
            sqlite3_bind_int64((sqlite3_stmt *)pStmt,1,iVar6);
            iVar4 = sqlite3_step((sqlite3_stmt *)ppStmt->pVtab);
            if (iVar4 != 100) {
              sqlite3_reset((sqlite3_stmt *)ppStmt->pVtab);
              iVar5 = 0;
              if (iVar4 != 0x65) {
                iVar5 = iVar4;
              }
              goto LAB_001d96e6;
            }
            *(undefined1 *)((long)&cur[1].pVtab + 2) = 1;
            bVar2 = pRtree->nDim2;
          }
          pValue = sqlite3_column_value((sqlite3_stmt *)cur[7].pVtab,(i - (uint)bVar2) + 1);
          sqlite3_result_value(ctx,pValue);
          iVar5 = 0;
        }
        else {
          readCoord(pNode->zData + (int)((uint)pRtree->nBytesPerCell * (uint)bVar1 + i * 4 + 8),&c);
          if (pRtree->eCoordType == '\0') {
            sqlite3_result_double(ctx,(double)c.f);
          }
          else {
            sqlite3_result_int(ctx,c.i);
          }
        }
      }
    }
    else {
      iVar5 = 4;
    }
  }
LAB_001d96e6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( NEVER(p==0) ) return SQLITE_OK;
  if( p->iCell>=NCELL(pNode) ) return SQLITE_ABORT;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1,
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }
  return SQLITE_OK;
}